

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O1

bool __thiscall
pg::PTLSolver::attractTangle(PTLSolver *this,int t,int pl,bitset *R,bitset *Z,bitset *G)

{
  pointer piVar1;
  undefined1 uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  piVar1 = (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar3 = piVar1[t];
  if ((uVar3 != 0xffffffff) && ((pl == -1 || ((uVar3 & 1) == pl)))) {
    uVar4 = (ulong)*(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start[t];
    if (uVar4 != 0xffffffffffffffff) {
      uVar5 = uVar4 >> 6;
      if (((this->G)._bits[uVar5] >> (uVar4 & 0x3f) & 1) != 0) {
        uVar4 = 1L << (uVar4 & 0x3f);
        uVar3 = 3;
        if ((Z->_bits[uVar5] & uVar4) == 0) {
          uVar3 = (uint)((R->_bits[uVar5] & uVar4) == 0);
        }
        uVar2 = (*(code *)(&DAT_0018f204 + *(int *)(&DAT_0018f204 + (ulong)uVar3 * 4)))();
        return (bool)uVar2;
      }
      piVar1[t] = -1;
    }
  }
  return false;
}

Assistant:

bool
PTLSolver::attractTangle(const int t, const int pl, bitset &R, bitset &Z, bitset &G)
{
    /**
     * Check if tangle is won by player <pl> and not deleted.
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (pl != -1 and pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if tangle is contained in Z+R and if any vertices are not already in Z
     * If no new vertices could be attracted, then don't attract...
     */
    {
        bool can_attract_new = false;
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!this->G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            } else if (Z[v]) {
                continue; // already attracted
            } else if (R[v]) {
                can_attract_new = true; // has vertices not yet attracted
            } else {
                return false; // not contained in Z+R
            }
        }
        if (!can_attract_new) return false;
    }

    /**
     * Check if the tangle can escape to G\Z.
     */
    {
        int v, *ptr = tout[t];
        while ((v=*ptr++) != -1) {
            if (Z[v]) continue;
            if (G[v]) return false; // opponent escapes
        }
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}